

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O2

VerySimpleReadOnlyString __thiscall
Strings::VerySimpleReadOnlyString::splitAt(VerySimpleReadOnlyString *this,int pos,int stripFromRet)

{
  int _length;
  int in_ECX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar1;
  undefined4 in_register_00000034;
  long *plVar2;
  VerySimpleReadOnlyString VVar3;
  
  plVar2 = (long *)CONCAT44(in_register_00000034,pos);
  if (stripFromRet < 0) {
    VerySimpleReadOnlyString(this,(tCharPtr)0x0,-1);
    uVar1 = extraout_RDX_00;
  }
  else {
    if (stripFromRet <= in_ECX) {
      in_ECX = stripFromRet;
    }
    _length = stripFromRet - in_ECX;
    if ((int)plVar2[1] <= stripFromRet - in_ECX) {
      _length = (int)plVar2[1];
    }
    VerySimpleReadOnlyString(this,(tCharPtr)*plVar2,_length);
    uVar1 = extraout_RDX;
    if ((int)plVar2[1] < stripFromRet) {
      *(undefined4 *)(plVar2 + 1) = 0;
    }
    else {
      *plVar2 = *plVar2 + (ulong)(uint)stripFromRet;
      *(int *)(plVar2 + 1) = (int)plVar2[1] - stripFromRet;
    }
  }
  VVar3._8_8_ = uVar1;
  VVar3.data = (tCharPtr)this;
  return VVar3;
}

Assistant:

VerySimpleReadOnlyString VerySimpleReadOnlyString::splitAt(int pos, int stripFromRet)
    {
        if (stripFromRet > pos) stripFromRet = pos;
        if (pos < 0) return VerySimpleReadOnlyString();
        VerySimpleReadOnlyString ret(data, min(pos - stripFromRet, length));
        if (pos > length) (void)Mutate(data, 0);
        else (void)Mutate(data + pos, length - pos);
        return ret;
    }